

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O2

void __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha256,_256UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
::evp_message_digest_context
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha256,_256UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
           *this)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  source_location local_58;
  evp_error local_40;
  
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  this->_context = (EVP_MD_CTX *)ctx;
  type = EVP_sha256();
  iVar1 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
  if (iVar1 != 0) {
    return;
  }
  local_40._32_8_ = 0;
  local_40._16_8_ = 0;
  local_40._24_8_ = 0;
  local_40._40_8_ = 0xffffffff;
  local_40._0_8_ = 0x2b7668;
  local_40._8_8_ = 0x2b7698;
  local_58.file_ =
       "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/message_digests/basic_message_digester.hxx"
  ;
  local_58.function_ =
       "cryptox::evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha256, 256>, &EVP_DigestInit_ex, &EVP_DigestUpdate, &EVP_DigestFinal_ex>::evp_message_digest_context() [Algorithm = cryptox::message_digest_algorithm<&EVP_sha256, 256>, InitFx = &EVP_DigestInit_ex, UpdateFx = &EVP_DigestUpdate, FinalFx = &EVP_DigestFinal_ex]"
  ;
  local_58.line_ = 0x23;
  local_58.column_ = 0;
  boost::throw_exception<cryptox::evp_error>(&local_40,&local_58);
}

Assistant:

evp_message_digest_context() {
			_context = EVP_MD_CTX_new();

			if (InitFx(_context, Algorithm::digest(), NULL) == 0)
				BOOST_THROW_EXCEPTION(evp_error());
		}